

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O2

int dsSet(dsCrate *crate)

{
  int iVar1;
  int iVar2;
  
  pthread_once(&keyOnce,makeKey);
  iVar1 = pthread_setspecific(key,crate);
  iVar2 = 0;
  if (iVar1 < 0) {
    dsRunLogCallback("%s(): Can\'t set pthread specific.\n","dsSet");
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
dsSet(dsCrate *crate)
{
	/*
	 * Set thread specific crate handle.
	 */
	pthread_once(&keyOnce, makeKey);
	if (pthread_setspecific(key, crate) < 0) {
		dsLog("Can't set pthread specific.\n");
		return -1;
	}

	return 0;
}